

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O2

void __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::run(reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
      *this,string *host,string *port_str)

{
  element_type *peVar1;
  fd_set *in_RCX;
  fd_set *in_R8;
  timeval *in_R9;
  string local_e0 [32];
  string local_c0 [32];
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  local_a0;
  
  select(this,(int)host,(fd_set *)port_str,in_RCX,in_R8,in_R9);
  peVar1 = (this->logic).
           super___shared_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__cxx11::string::string(local_c0,(string *)host);
  std::__cxx11::string::string(local_e0,(string *)port_str);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(&local_a0,&this->request_);
  (*peVar1->_vptr_interface[9])(peVar1,local_c0,local_e0,&local_a0);
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::~message(&local_a0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

void run(std::string host, std::string port_str)
		{
			select();
			logic->run(std::move(host), std::move(port_str), request_);
		}